

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main_average(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  int iVar7;
  double dVar8;
  int iVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> data;
  vector<double,_std::allocator<double>_> output;
  FC_BPNN bp;
  allocator_type local_13a;
  allocator_type local_139;
  vector<double,_std::allocator<double>_> local_138;
  double local_120;
  vector<double,_std::allocator<double>_> local_118;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  double local_c0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  undefined1 local_88 [16];
  FC_BPNN local_78;
  
  local_f8._8_8_ = local_f8._0_8_;
  FC_BPNN::FC_BPNN(&local_78,4,10,1);
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_f8._0_8_ = 0.251;
  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
            (&local_138,(iterator)0x0,(double *)local_f8);
  local_f8._0_8_ = 0.425;
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_138,
               (iterator)
               local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,(double *)local_f8);
  }
  else {
    *local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0.425;
    local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_f8._0_8_ = 0.775;
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_138,
               (iterator)
               local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,(double *)local_f8);
  }
  else {
    *local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0.775;
    local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_f8._0_8_ = 0x3fee76c8b4395810;
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_138,
               (iterator)
               local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,(double *)local_f8);
  }
  else {
    *local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0.952;
    local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar6 = 1;
  local_120 = 0.0;
  do {
    uVar1 = rand();
    uVar2 = rand();
    uVar3 = rand();
    uVar4 = rand();
    iVar7 = (int)((ulong)uVar1 * 0x10624dd3 >> 0x20) - (-(uint)((int)uVar1 < 0) & 0x10624dd3);
    iVar11 = (int)((ulong)uVar2 * 0x10624dd3 >> 0x20) - (-(uint)((int)uVar2 < 0) & 0x10624dd3);
    auVar9._0_8_ = (double)(int)(uVar1 + ((iVar7 >> 6) - (iVar7 >> 0x1f)) * -1000);
    auVar9._8_8_ = (double)(int)(uVar2 + ((iVar11 >> 6) - (iVar11 >> 0x1f)) * -1000);
    local_f8 = divpd(auVar9,_DAT_00106160);
    iVar7 = (int)((ulong)uVar3 * 0x10624dd3 >> 0x20) - (-(uint)((int)uVar3 < 0) & 0x10624dd3);
    iVar11 = (int)((ulong)uVar4 * 0x10624dd3 >> 0x20) - (-(uint)((int)uVar4 < 0) & 0x10624dd3);
    auVar10._0_8_ = (double)(int)(uVar3 + ((iVar7 >> 6) - (iVar7 >> 0x1f)) * -1000);
    auVar10._8_8_ = (double)(int)(uVar4 + ((iVar11 >> 6) - (iVar11 >> 0x1f)) * -1000);
    local_e8 = divpd(auVar10,_DAT_00106160);
    __l._M_len = 4;
    __l._M_array = (iterator)local_f8;
    local_d8._0_16_ = local_f8;
    local_88 = local_e8;
    std::vector<double,_std::allocator<double>_>::vector(&local_a0,__l,&local_139);
    local_c0 = ((double)local_88._8_8_ +
               (double)local_d8._8_8_ + (double)local_d8._0_8_ + (double)local_88._0_8_) * 0.25;
    __l_00._M_len = 1;
    __l_00._M_array = &local_c0;
    std::vector<double,_std::allocator<double>_>::vector(&local_b8,__l_00,&local_13a);
    dVar8 = FC_BPNN::train_once(&local_78,&local_a0,&local_b8);
    local_d8._0_8_ = dVar8;
    if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_120 = local_120 + (double)local_d8._0_8_;
    if ((byte)(((byte)((uVar6 & 0xff) / 5) & 0xfe) * -5 + (char)uVar6) == '\0') {
      local_120 = local_120 / 10.0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iter: ",6);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," cost: ",7);
      poVar5 = std::ostream::_M_insert<double>(local_120);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," step: ",7);
      dVar8 = FC_BPNN::getLearningStep(&local_78);
      poVar5 = std::ostream::_M_insert<double>(dVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      local_120 = 0.0;
      std::ostream::flush();
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x65);
  FC_BPNN::predict(&local_78,&local_138,&local_118);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"prediction: ",0xc);
  poVar5 = std::ostream::_M_insert<double>
                     (*local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," gt: ",5);
  poVar5 = std::ostream::_M_insert<double>
                     ((*local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start +
                       local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[1] +
                       local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[2] +
                      local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[3]) * 0.25);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  FC_BPNN::~FC_BPNN(&local_78);
  return 1;
}

Assistant:

int main_average() {
	FC_BPNN bp(4, 10, 1);
	std::vector<double> data; data.push_back(0.251); data.push_back(0.425); data.push_back(0.775); data.push_back(0.952);
	std::vector<double> output;
	double lastCost = 0.0; double cost = 0.0;
	for (int i = 1; i <= 100; i++) {
		double a = (double)(rand() % 1000) / 1000;
		double b = (double)(rand() % 1000) / 1000;
		double c = (double)(rand() % 1000) / 1000;
		double d = (double)(rand() % 1000) / 1000;
		cost += bp.train_once({ a ,b, c,d }, { average4(a,b,c,d) });
		if (i % 10 == 0) {
			cost /= 10;
			std::cout << "iter: " << i << " cost: " << cost << " step: " << bp.getLearningStep() << std::endl;
			lastCost = cost;
			cost = 0.0;
		}
	}
	bp.predict(data, output);
	std::cout << "prediction: " << output[0] << " gt: " << average4(data[0], data[1], data[2], data[3]) << std::endl;
	return 1;
}